

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<ClassInfoDef>::moveAppend
          (QGenericArrayOps<ClassInfoDef> *this,ClassInfoDef *b,ClassInfoDef *e)

{
  qsizetype *pqVar1;
  ClassInfoDef *pCVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pCVar2 = (this->super_QArrayDataPointer<ClassInfoDef>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<ClassInfoDef>).size;
      pDVar4 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pCVar2[lVar3].name.d.d = pDVar4;
      pcVar5 = (b->name).d.ptr;
      (b->name).d.ptr = (char *)0x0;
      pCVar2[lVar3].name.d.ptr = pcVar5;
      qVar6 = (b->name).d.size;
      (b->name).d.size = 0;
      pCVar2[lVar3].name.d.size = qVar6;
      pDVar4 = (b->value).d.d;
      (b->value).d.d = (Data *)0x0;
      pCVar2[lVar3].value.d.d = pDVar4;
      pcVar5 = (b->value).d.ptr;
      (b->value).d.ptr = (char *)0x0;
      pCVar2[lVar3].value.d.ptr = pcVar5;
      qVar6 = (b->value).d.size;
      (b->value).d.size = 0;
      pCVar2[lVar3].value.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<ClassInfoDef>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }